

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O3

void __thiscall Statements::evaluate(Statements *this,SymTab *symTab)

{
  pointer ppFVar1;
  pointer ppFVar2;
  bool bVar3;
  Functions *this_00;
  Function *pFVar4;
  Function *function;
  ulong uVar5;
  pointer ppSVar6;
  pointer ppSVar7;
  vector<Statement_*,_std::allocator<Statement_*>_> stack;
  vector<Function_*,_std::allocator<Function_*>_> functionStack;
  vector<Function_*,_std::allocator<Function_*>_> local_98;
  pointer local_80;
  Functions *local_78;
  vector<Function_*,_std::allocator<Function_*>_> local_70;
  SymTab *local_58;
  Function *local_50;
  vector<Statement_*,_std::allocator<Statement_*>_> local_48;
  
  local_58 = symTab;
  this_00 = (Functions *)operator_new(0x18);
  (this_00->_functionStack).super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->_functionStack).super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->_functionStack).super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppSVar7 = (this->_statements).super__Vector_base<Statement_*,_std::allocator<Statement_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppSVar6 = (this->_statements).super__Vector_base<Statement_*,_std::allocator<Statement_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_80 = ppSVar6;
  local_78 = this_00;
  if (ppSVar7 != ppSVar6) {
    do {
      pFVar4 = (Function *)*ppSVar7;
      if (pFVar4 != (Function *)0x0) {
        if ((pFVar4->super_Statement).isFunction == true) {
          pFVar4 = (Function *)__dynamic_cast(pFVar4,&Statement::typeinfo,&Function::typeinfo,0);
          Functions::addFunction(this_00,pFVar4);
        }
        else {
          std::vector<Function_*,_std::allocator<Function_*>_>::vector
                    (&local_98,&this_00->_functionStack);
          ppFVar2 = local_98.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          ppFVar1 = local_98.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (local_98.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_98.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_98.
                                  super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_98.
                                  super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          ppSVar6 = local_80;
          this_00 = local_78;
          if (ppFVar1 != ppFVar2) {
            function = (Function *)__dynamic_cast(pFVar4,&Statement::typeinfo,&Function::typeinfo,0)
            ;
            this_00 = local_78;
            bVar3 = Functions::findFunction(local_78,function);
            if (bVar3) {
              pFVar4 = (Function *)__dynamic_cast(pFVar4,&Statement::typeinfo,&Function::typeinfo,0)
              ;
              pFVar4 = Functions::returnFunction(this_00,pFVar4);
            }
            local_98.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_98.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_98.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::vector<Function_*,_std::allocator<Function_*>_>::vector
                      (&local_70,&this_00->_functionStack);
            if (local_70.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_70.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                super__Vector_impl_data._M_start) {
              uVar5 = 0;
              do {
                local_50 = local_70.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar5];
                std::vector<Statement*,std::allocator<Statement*>>::emplace_back<Statement*>
                          ((vector<Statement*,std::allocator<Statement*>> *)&local_98,
                           (Statement **)&local_50);
                uVar5 = uVar5 + 1;
              } while (uVar5 < (ulong)((long)local_70.
                                             super__Vector_base<Function_*,_std::allocator<Function_*>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_70.
                                             super__Vector_base<Function_*,_std::allocator<Function_*>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 3));
            }
            std::vector<Statement_*,_std::allocator<Statement_*>_>::vector
                      (&local_48,(vector<Statement_*,_std::allocator<Statement_*>_> *)&local_98);
            (*(pFVar4->super_Statement)._vptr_Statement[2])(pFVar4,&local_48);
            ppSVar6 = local_80;
            if (local_48.super__Vector_base<Statement_*,_std::allocator<Statement_*>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_48.super__Vector_base<Statement_*,_std::allocator<Statement_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_48.
                                    super__Vector_base<Statement_*,_std::allocator<Statement_*>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_48.
                                    super__Vector_base<Statement_*,_std::allocator<Statement_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_70.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_70.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_70.
                                    super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_70.
                                    super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_98.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_98.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_98.
                                    super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_98.
                                    super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
          }
          (*(pFVar4->super_Statement)._vptr_Statement[1])(pFVar4,local_58);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
          std::ostream::put('p');
          std::ostream::flush();
        }
      }
      ppSVar7 = ppSVar7 + 1;
    } while (ppSVar7 != ppSVar6);
  }
  return;
}

Assistant:

void Statements::evaluate(SymTab &symTab) {
    //std::cout << "Evaluating Statements...\n";
    auto *funcs= new Functions();
    for (auto s: _statements) {
        if(s == NULL) continue;
        if(s->isFunction){
            funcs->addFunction(dynamic_cast<Function *>(s));
        } else {
            if(!funcs->getFunctionStack().empty()) {
                if(funcs->findFunction(dynamic_cast<Function *>(s))) {
                    s = funcs->returnFunction(dynamic_cast<Function *>(s));
                }
                std::vector<Statement*>stack;
                std::vector<Function*>functionStack = funcs->getFunctionStack();
                //funcs->setStack(functionStack);
                for(int i = 0; i < functionStack.size();i++){
                    Function *function = functionStack[i];
                    stack.push_back(function);
                }
                s->passStack(stack);
                //s->passFunctions(reinterpret_cast<Statement*>(funcs->returnFunction(dynamic_cast<Function *>(s))));

            }
            s->evaluate(symTab);
            std::cout << std::endl;
        }
    }
}